

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_lazy_message_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableLazyMessageOneofFieldGenerator::GenerateBuildingCode
          (ImmutableLazyMessageOneofFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  
  variables = &(this->super_ImmutableLazyMessageFieldGenerator).super_ImmutableMessageFieldGenerator
               .variables_;
  io::Printer::Print(printer,variables,"if ($has_oneof_case_message$) {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,variables,
                     "result.$oneof_name$_ = new $lazy_type$();\n(($lazy_type$) result.$oneof_name$_).set(\n    (($lazy_type$) $oneof_name$_));\n"
                    );
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void ImmutableLazyMessageOneofFieldGenerator::
GenerateBuildingCode(io::Printer* printer) const {
  printer->Print(variables_,
                 "if ($has_oneof_case_message$) {\n");
  printer->Indent();

  printer->Print(variables_,
      "result.$oneof_name$_ = new $lazy_type$();\n"
      "(($lazy_type$) result.$oneof_name$_).set(\n"
      "    (($lazy_type$) $oneof_name$_));\n");
  printer->Outdent();
  printer->Print("}\n");
}